

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,std::mutex>,void>
               (parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_std::mutex>
                *container,ostream *os)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_1 value;
  long lVar2;
  const_iterator __begin0;
  char local_61;
  iterator local_60;
  
  local_60.inner_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin(&local_60,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)container);
  if (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0) {
    lVar2 = 0;
    do {
      value = local_60.it_.field_1;
      if (lVar2 == 0) {
LAB_00141f5e:
        local_61 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        PrintTo<int_const,int>((pair<const_int,_int> *)value.slot_,os);
        lVar2 = lVar2 + 1;
        bVar1 = true;
      }
      else {
        local_61 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        if (lVar2 != 0x20) goto LAB_00141f5e;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar2 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      phmap::priv::
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::iterator::operator++(&local_60);
    } while (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0);
    if (lVar2 != 0) {
      local_60.inner_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
    }
  }
  local_60.inner_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }